

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O3

void print_section(ares_dns_record_t *dnsrec,ares_dns_section_t section)

{
  size_t sVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  undefined4 uVar7;
  long lVar8;
  ares_dns_rr_t *paVar9;
  undefined8 uVar10;
  char *pcVar11;
  size_t sVar12;
  undefined8 uVar13;
  ulong uVar14;
  size_t *psVar15;
  long lVar16;
  uchar *puVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  size_t sVar22;
  bool bVar23;
  size_t val_len;
  long read_len;
  ulong local_178;
  long local_170;
  undefined8 local_168;
  undefined8 local_160;
  ulong local_158;
  ares_dns_section_t local_150;
  undefined4 local_14c;
  ares_dns_record_t *local_148;
  ulong local_140;
  size_t local_138 [33];
  
  lVar8 = ares_dns_record_rr_cnt();
  if ((lVar8 != 0) &&
     ((lVar8 = ares_dns_record_rr_cnt(dnsrec,section), lVar8 != 1 ||
      (paVar9 = has_opt(dnsrec,section), paVar9 == (ares_dns_rr_t *)0x0)))) {
    if (global_config.opts.display_comments != ARES_FALSE) {
      uVar10 = ares_dns_section_tostr(section);
      printf(";; %s SECTION:\n",uVar10);
    }
    lVar8 = ares_dns_record_rr_cnt(dnsrec,section);
    if (lVar8 != 0) {
      uVar19 = 0;
      local_150 = section;
      local_148 = dnsrec;
      do {
        uVar10 = ares_dns_record_rr_get_const(dnsrec,section,uVar19);
        iVar4 = ares_dns_rr_get_type(uVar10);
        if (iVar4 != 0x29) {
          pcVar11 = (char *)ares_dns_rr_get_name(uVar10);
          local_158 = 0;
          local_168 = uVar10;
          uVar5 = ares_dns_rr_get_type(uVar10);
          lVar8 = ares_dns_rr_get_keys(uVar5,&local_158);
          if (pcVar11 != (char *)0x0) {
            sVar12 = strlen(pcVar11);
            printf("%s.\t",pcVar11);
            if (sVar12 < 0x18) {
              putchar(9);
            }
            if (global_config.opts.display_ttl != ARES_FALSE) {
              uVar6 = ares_dns_rr_get_ttl(local_168);
              printf("%u\t",(ulong)uVar6);
            }
            uVar10 = local_168;
            local_140 = uVar19;
            if (global_config.opts.display_class != ARES_FALSE) {
              uVar7 = ares_dns_rr_get_class(local_168);
              uVar13 = ares_dns_class_tostr(uVar7);
              printf("%s\t",uVar13);
            }
            uVar13 = ares_dns_rec_type_tostr(uVar5);
            printf("%s\t",uVar13);
            if (local_158 != 0) {
              uVar19 = 0;
              do {
                uVar5 = ares_dns_rr_key_datatype(*(undefined4 *)(lVar8 + uVar19 * 4));
                if (uVar19 != 0) {
                  putchar(0x20);
                }
                switch(uVar5) {
                case 1:
                  uVar10 = ares_dns_rr_get_addr(uVar10);
                  memset(local_138,0,0x100);
                  uVar13 = 2;
                  goto LAB_00105057;
                case 2:
                  uVar10 = ares_dns_rr_get_addr6(uVar10);
                  memset(local_138,0,0x100);
                  uVar13 = 10;
LAB_00105057:
                  psVar15 = local_138;
                  ares_inet_ntop(uVar13,uVar10,psVar15,0x100);
                  pcVar11 = "%s";
                  uVar10 = local_168;
                  goto LAB_001050ab;
                case 3:
                  bVar2 = ares_dns_rr_get_u8(uVar10,*(undefined4 *)(lVar8 + uVar19 * 4));
                  uVar18 = (ulong)bVar2;
                  goto LAB_00104fc9;
                case 4:
                  uVar3 = ares_dns_rr_get_u16(uVar10,*(undefined4 *)(lVar8 + uVar19 * 4));
                  uVar18 = (ulong)uVar3;
                  goto LAB_00104fc9;
                case 5:
                  uVar6 = ares_dns_rr_get_u32(uVar10,*(undefined4 *)(lVar8 + uVar19 * 4));
                  uVar18 = (ulong)uVar6;
LAB_00104fc9:
                  printf("%u",uVar18);
                  break;
                case 6:
                  psVar15 = (size_t *)
                            ares_dns_rr_get_str(uVar10,*(undefined4 *)(lVar8 + uVar19 * 4));
                  pcVar11 = "%s.";
                  goto LAB_001050ab;
                case 7:
                  psVar15 = (size_t *)
                            ares_dns_rr_get_str(uVar10,*(undefined4 *)(lVar8 + uVar19 * 4));
                  pcVar11 = "\"%s\"";
LAB_001050ab:
                  printf(pcVar11,psVar15);
                  break;
                case 8:
                  local_138[0] = 0;
                  lVar16 = ares_dns_rr_get_bin(uVar10,*(undefined4 *)(lVar8 + uVar19 * 4),local_138)
                  ;
                  sVar1 = local_138[0];
                  uVar10 = local_168;
                  if (local_138[0] != 0) {
                    sVar22 = 0;
                    do {
                      printf("%02x",(ulong)*(byte *)(lVar16 + sVar22));
                      sVar22 = sVar22 + 1;
                      uVar10 = local_168;
                    } while (sVar1 != sVar22);
                  }
                  break;
                case 9:
                  puVar17 = (uchar *)ares_dns_rr_get_bin(uVar10,*(undefined4 *)(lVar8 + uVar19 * 4),
                                                         local_138);
                  print_opt_binp(puVar17,local_138[0]);
                  break;
                case 10:
                  uVar5 = *(undefined4 *)(lVar8 + uVar19 * 4);
                  lVar16 = ares_dns_rr_get_opt_cnt(uVar10,uVar5);
                  if (lVar16 != 0) {
                    uVar18 = 0;
                    local_14c = uVar5;
                    do {
                      local_178 = 0;
                      local_170 = 0;
                      if (uVar18 != 0) {
                        putchar(0x20);
                      }
                      uVar3 = ares_dns_rr_get_opt(uVar10,uVar5,uVar18,&local_170,&local_178);
                      lVar16 = ares_dns_opt_get_name(uVar5,uVar3);
                      if (lVar16 == 0) {
                        printf("key%u",(ulong)uVar3);
                      }
                      else {
                        printf("%s",lVar16);
                      }
                      if (local_178 == 0) break;
                      putchar(0x3d);
                      uVar5 = ares_dns_opt_get_datatype(uVar5);
                      lVar16 = local_170;
                      uVar14 = local_178;
                      switch(uVar5) {
                      case 1:
                        if (local_178 != 0) {
LAB_00104ee2:
                          printf("INVALID!");
                        }
                        break;
                      case 2:
                        putchar(0x22);
                        if (uVar14 != 0) {
                          lVar20 = 0;
                          do {
                            local_138[0] = 0;
                            local_160 = 0;
                            bVar23 = lVar20 != 0;
                            lVar20 = lVar20 + -1;
                            if (bVar23) {
                              putchar(0x2c);
                            }
                            iVar4 = ares_expand_string(lVar16,lVar16,uVar14 & 0xffffffff,&local_160,
                                                       local_138);
                            if (iVar4 != 0) {
                              printf("INVALID");
                              break;
                            }
                            printf("%s",local_160);
                            ares_free_string(local_160);
                            lVar16 = lVar16 + local_138[0];
                            uVar14 = uVar14 - local_138[0];
                          } while (uVar14 != 0);
                        }
                        putchar(0x22);
                        break;
                      case 3:
                        if (local_178 != 0) {
                          uVar21 = 0;
                          do {
                            if (uVar21 != 0) {
                              putchar(0x2c);
                            }
                            printf("%u",(ulong)*(byte *)(lVar16 + uVar21));
                            uVar21 = uVar21 + 1;
                          } while (uVar14 != uVar21);
                        }
                        break;
                      case 4:
                      case 5:
                        if ((local_178 & 1) != 0 || local_178 < 2) goto LAB_00104ee2;
                        uVar21 = 0;
                        do {
                          uVar3 = *(ushort *)(lVar16 + uVar21);
                          if (uVar21 != 0) {
                            putchar(0x2c);
                          }
                          printf("%u",(ulong)(ushort)(uVar3 << 8 | uVar3 >> 8));
                          uVar21 = uVar21 + 2;
                        } while (uVar21 < uVar14);
                        break;
                      case 6:
                      case 7:
                        if ((local_178 & 3) != 0 || local_178 < 4) goto LAB_00104ee2;
                        uVar21 = 0;
                        do {
                          uVar6 = *(uint *)(lVar16 + uVar21);
                          if (uVar21 != 0) {
                            putchar(0x2c);
                          }
                          printf("%u",(ulong)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 |
                                              (uVar6 & 0xff00) << 8 | uVar6 << 0x18));
                          uVar21 = uVar21 + 4;
                        } while (uVar21 < uVar14);
                        break;
                      case 8:
                        if ((local_178 & 3) != 0) goto LAB_00104ee2;
                        if (local_178 != 0) {
                          uVar21 = 0;
                          do {
                            memset(local_138,0,0x100);
                            ares_inet_ntop(2,lVar16 + uVar21,local_138,0x100);
                            if (uVar21 != 0) {
                              putchar(0x2c);
                            }
                            printf("%s");
                            uVar21 = uVar21 + 4;
                          } while (uVar21 < uVar14);
                        }
                        break;
                      case 9:
                        if ((local_178 & 0xf) != 0) goto LAB_00104ee2;
                        if (local_178 != 0) {
                          uVar21 = 0;
                          do {
                            memset(local_138,0,0x100);
                            ares_inet_ntop(10,lVar16 + uVar21,local_138,0x100);
                            if (uVar21 != 0) {
                              putchar(0x2c);
                            }
                            printf("%s");
                            uVar21 = uVar21 + 0x10;
                          } while (uVar21 < uVar14);
                        }
                        break;
                      case 10:
                        if (local_178 != 0) {
                          uVar21 = 0;
                          do {
                            printf("%02x",(ulong)*(byte *)(lVar16 + uVar21));
                            uVar21 = uVar21 + 1;
                          } while (uVar14 != uVar21);
                        }
                        break;
                      case 0xb:
                        local_138[0] = 0;
                        local_160 = 0;
                        iVar4 = ares_expand_name(local_170,local_170,local_178 & 0xffffffff,
                                                 local_138,&local_160);
                        if (iVar4 != 0) goto LAB_00104ee2;
                        printf("%s.",local_138[0]);
                        ares_free_string(local_138[0]);
                      }
                      uVar5 = local_14c;
                      uVar10 = local_168;
                      uVar18 = uVar18 + 1;
                      uVar14 = ares_dns_rr_get_opt_cnt(local_168,local_14c);
                    } while (uVar18 < uVar14);
                  }
                  break;
                case 0xb:
                  uVar5 = *(undefined4 *)(lVar8 + uVar19 * 4);
                  lVar16 = ares_dns_rr_get_abin_cnt(uVar10,uVar5);
                  if (lVar16 != 0) {
                    lVar20 = 0;
                    do {
                      puVar17 = (uchar *)ares_dns_rr_get_abin(uVar10,uVar5,lVar20,local_138);
                      if (lVar20 != 0) {
                        putchar(0x20);
                      }
                      print_opt_binp(puVar17,local_138[0]);
                      lVar20 = lVar20 + 1;
                    } while (lVar16 != lVar20);
                  }
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 < local_158);
            }
            putchar(10);
            uVar19 = local_140;
            dnsrec = local_148;
            section = local_150;
          }
        }
        uVar19 = uVar19 + 1;
        uVar18 = ares_dns_record_rr_cnt(dnsrec,section);
      } while (uVar19 < uVar18);
    }
    if (global_config.opts.display_comments != ARES_FALSE) {
      putchar(10);
    }
  }
  return;
}

Assistant:

static void print_section(const ares_dns_record_t *dnsrec,
                          ares_dns_section_t       section)
{
  size_t i;

  if (ares_dns_record_rr_cnt(dnsrec, section) == 0 ||
      (ares_dns_record_rr_cnt(dnsrec, section) == 1 &&
       has_opt(dnsrec, section) != NULL)) {
    return;
  }

  if (global_config.opts.display_comments) {
    printf(";; %s SECTION:\n", ares_dns_section_tostr(section));
  }
  for (i = 0; i < ares_dns_record_rr_cnt(dnsrec, section); i++) {
    const ares_dns_rr_t *rr = ares_dns_record_rr_get_const(dnsrec, section, i);
    if (ares_dns_rr_get_type(rr) == ARES_REC_TYPE_OPT) {
      continue;
    }
    print_rr(rr);
  }
  if (global_config.opts.display_comments) {
    printf("\n");
  }
}